

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsum.c
# Opt level: O3

int bsumMain(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char cVar4;
  bool_t bVar5;
  u32 uVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  file_t file;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  char **ppcVar16;
  ulong hid;
  int iVar17;
  octet hash [64];
  char str [136];
  long local_490;
  long local_488;
  octet local_478 [62];
  char acStack_43a [1034];
  
  if (argc < 2) {
    printf("bee2cmd/%s: %s\nUsage:\n  bsum [hash_alg] <file_to_hash> <file_to_hash> ...\n  bsum [hash_alg] -c <checksum_file>\n  hash_alg:\n    -belt-hash (STB 34.101.31), by default\n    -bash32, -bash64, ..., -bash512 (STB 34.101.77)\n    -bash-prg-hashNNND (STB 34.101.77)\n      with NNN in {256, 384, 512}, D in {1, 2}\n      \\note annonce = NULL\n  \\remark use \"--\" to stop parsing options"
           ,"bsum","hash files using {belt|bash} algorithms");
    return -1;
  }
  ppcVar16 = argv + 2;
  uVar12 = 0xffffffffffffffff;
  lVar14 = 0;
  bVar1 = false;
  while( true ) {
    bVar5 = strStartsWith(argv[lVar14 + 1],"-");
    if (bVar5 == 0) break;
    bVar5 = strStartsWith(argv[lVar14 + 1],"-belt-hash");
    if (bVar5 == 0) {
      bVar5 = strStartsWith(argv[lVar14 + 1],"-bash-prg-hash");
      pcVar11 = argv[lVar14 + 1];
      if (bVar5 == 0) {
        bVar5 = strStartsWith(pcVar11,"-bash");
        pcVar11 = argv[lVar14 + 1];
        if (bVar5 == 0) {
          iVar7 = strCmp(pcVar11,"-c");
          if (iVar7 == 0) {
            bVar2 = !bVar1;
            bVar1 = true;
            if (bVar2) goto LAB_00102da8;
          }
          else {
            iVar7 = strCmp(argv[lVar14 + 1],"--");
            if (iVar7 == 0) {
              iVar7 = (argc - (int)lVar14) + -2;
              goto LAB_00102df8;
            }
          }
          goto LAB_0010312b;
        }
        sVar9 = strLen("-bash");
        if (uVar12 != 0xffffffffffffffff) goto LAB_0010312b;
        pcVar11 = pcVar11 + sVar9;
        bVar5 = decIsValid(pcVar11);
        if (((bVar5 == 0) || (sVar9 = strLen(pcVar11), sVar9 < 2)) ||
           (sVar9 = strLen(pcVar11), 4 < sVar9)) goto LAB_0010312b;
      }
      else {
        sVar9 = strLen("-bash-prg-hash");
        if (uVar12 != 0xffffffffffffffff) goto LAB_0010312b;
        pcVar11 = pcVar11 + sVar9;
        bVar5 = decIsValid(pcVar11);
        if ((bVar5 == 0) || (sVar9 = strLen(pcVar11), sVar9 != 4)) goto LAB_0010312b;
      }
      sVar9 = decCLZ(pcVar11);
      if (sVar9 != 0) goto LAB_0010312b;
      uVar6 = decToU32(pcVar11);
      uVar12 = (ulong)uVar6;
      bVar5 = bsumHidIsValid(uVar12);
      if (bVar5 == 0) goto LAB_0010312b;
    }
    else {
      if (uVar12 != 0xffffffffffffffff) goto LAB_0010312b;
      uVar12 = 0;
    }
LAB_00102da8:
    lVar14 = lVar14 + 1;
    ppcVar16 = ppcVar16 + 1;
    if (argc + -1 == (int)lVar14) goto LAB_0010312b;
  }
  iVar7 = (argc + -1) - (int)lVar14;
  ppcVar16 = ppcVar16 + -1;
LAB_00102df8:
  if ((0 < iVar7) && ((!bVar1 || (iVar7 == 1)))) {
    hid = 0;
    if (uVar12 != 0xffffffffffffffff) {
      hid = uVar12;
    }
    if (!bVar1) {
      uVar12 = hid >> 3;
      if (0x200 < hid) {
        uVar12 = hid / 0x50;
      }
      sVar9 = 0x20;
      if (hid != 0) {
        sVar9 = uVar12;
      }
      lVar14 = 0;
      iVar17 = 0;
      do {
        iVar8 = bsumHash(local_478,hid,ppcVar16[lVar14]);
        iVar3 = -1;
        if (iVar8 == 0) {
          pcVar11 = acStack_43a + 2;
          hexFrom(pcVar11,local_478,sVar9);
          hexLower(pcVar11);
          printf("%s  %s\n",pcVar11,ppcVar16[lVar14]);
          iVar3 = iVar17;
        }
        iVar17 = iVar3;
        lVar14 = lVar14 + 1;
      } while (iVar7 != (int)lVar14);
      return iVar17;
    }
    pcVar11 = *ppcVar16;
    if (hid == 0) {
      uVar12 = 0x20;
    }
    else if (hid < 0x201) {
      uVar12 = hid >> 3;
    }
    else {
      uVar12 = hid / 0x50;
    }
    file = fileOpen(pcVar11,"rb");
    if (file == (file_t)0x0) {
      pcVar10 = "%s: No such file\n";
      goto LAB_001030fd;
    }
    pcVar10 = fileGets(acStack_43a + 2,0x400,file);
    if (pcVar10 != (char *)0x0) {
      pcVar10 = acStack_43a + 2;
      local_490 = 0;
      local_488 = 0;
      lVar14 = 0;
      goto LAB_00102fa4;
    }
    bVar5 = fileClose(file);
    if (bVar5 == 0) goto LAB_001030f1;
    lVar14 = 0;
    local_488 = 0;
    goto LAB_001030e0;
  }
LAB_0010312b:
  bsumMain_cold_3();
  return -1;
LAB_00102fa4:
  sVar9 = strLen(pcVar10);
  if (((sVar9 < uVar12 * 2 + 2) || (acStack_43a[uVar12 * 2 + 2] != ' ')) ||
     (acStack_43a[uVar12 * 2 + 3] != ' ')) {
LAB_00103007:
    lVar14 = lVar14 + 1;
  }
  else {
    acStack_43a[uVar12 * 2 + 2] = '\0';
    bVar5 = hexIsValid(pcVar10);
    if (bVar5 == 0) goto LAB_00103007;
    cVar4 = acStack_43a[sVar9 + 1];
    if (cVar4 == '\n') {
      acStack_43a[sVar9 + 1] = '\0';
      cVar4 = acStack_43a[sVar9];
      lVar15 = sVar9 - 2;
    }
    else {
      lVar15 = sVar9 - 1;
    }
    if (cVar4 == '\r') {
      acStack_43a[lVar15 + 2] = '\0';
    }
    iVar7 = bsumHash(local_478,hid,acStack_43a + uVar12 * 2 + 4);
    if (iVar7 == -1) {
      local_488 = local_488 + 1;
    }
    else {
      bVar5 = hexEq(local_478,pcVar10);
      if (bVar5 == 0) {
        local_490 = local_490 + 1;
        pcVar13 = "%s: FAILED [checksum]\n";
      }
      else {
        pcVar13 = "%s: OK\n";
      }
      printf(pcVar13,acStack_43a + uVar12 * 2 + 4);
    }
  }
  pcVar13 = fileGets(pcVar10,0x400,file);
  if (pcVar13 == (char *)0x0) {
    bVar5 = fileClose(file);
    if (bVar5 == 0) {
LAB_001030f1:
      pcVar10 = "%s: FAILED [close]\n";
LAB_001030fd:
      printf(pcVar10,pcVar11);
      return -1;
    }
    if (lVar14 != 0) {
      pcVar11 = "WARNING: %lu input lines (out of %lu) are improperly formatted\n";
      if (lVar14 == 1) {
        pcVar11 = "WARNING: %lu input line (out of %lu) is improperly formatted\n";
      }
      fprintf(_stderr,pcVar11,lVar14);
    }
    if (local_488 != 0) {
      bsumMain_cold_1();
    }
    if (local_490 == 0) {
LAB_001030e0:
      bVar1 = false;
    }
    else {
      bsumMain_cold_2();
      bVar1 = true;
    }
    return -(uint)((lVar14 != 0 || local_488 != 0) || bVar1);
  }
  goto LAB_00102fa4;
}

Assistant:

int bsumMain(int argc, char* argv[])
{
	err_t code = ERR_OK;
	size_t hid = SIZE_MAX;
	bool_t check = FALSE;
#ifdef OS_WIN
	setlocale(LC_ALL, "russian_belarus.1251");
#endif
	// справка
	if (argc < 2)
		return bsumUsage();
	// разбор опций
	++argv, --argc;
	while (argc && strStartsWith(argv[0], "-"))
	{
		// belt-hash
		if (strStartsWith(argv[0], "-belt-hash"))
		{
			if (hid != SIZE_MAX)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			hid = 0;
			--argc, ++argv;
		}
		// bash-prg-hash
		else if (strStartsWith(argv[0], "-bash-prg-hash"))
		{
			char* alg_name = argv[0] + strLen("-bash-prg-hash");
			if (hid != SIZE_MAX || !decIsValid(alg_name) ||
				strLen(alg_name) != 4 || decCLZ(alg_name) ||
				!bsumHidIsValid(hid = (size_t)decToU32(alg_name)))
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			--argc, ++argv;
		}
		// bash
		else if (strStartsWith(argv[0], "-bash"))
		{
			char* alg_name = argv[0] + strLen("-bash");
			if (hid != SIZE_MAX || !decIsValid(alg_name) ||
				2 > strLen(alg_name) || strLen(alg_name) > 4 ||
				decCLZ(alg_name) ||
				!bsumHidIsValid(hid = (size_t)decToU32(alg_name)))
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			--argc, ++argv;
		}
		// check
		else if (strEq(argv[0], "-c"))
		{
			if (check)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			check = TRUE;
			--argc, ++argv;
		}
		// --
		else if (strEq(argv[0], "--"))
		{
			--argc, ++argv;
			break;
		}
		else
		{
			code = ERR_CMD_PARAMS;
			break;
		}
	}
	// дополнительные проверки и обработка ошибок
	if (code == ERR_OK && (argc < 1 || check && argc != 1))
		code = ERR_CMD_PARAMS;
	if (code != ERR_OK)
	{
		fprintf(stderr, "bee2cmd/%s: %s\n", _name, errMsg(code));
		return -1;
	}
	// belt-hash по умолчанию
	if (hid == SIZE_MAX)
		hid = 0;
	// вычисление/проверка хэш-значениий
	ASSERT(bsumHidIsValid(hid));
	return check ? bsumCheck(hid, argv[0]) : bsumPrint(hid, argc, argv);
}